

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>::clear
          (SmallVector<diligent_spirv_cross::Resource,_8UL> *this)

{
  Resource *pRVar1;
  long *plVar2;
  ulong uVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = (this->super_VectorView<diligent_spirv_cross::Resource>).buffer_size;
  if (uVar3 != 0) {
    lVar5 = 0x20;
    uVar6 = 0;
    do {
      pRVar1 = (this->super_VectorView<diligent_spirv_cross::Resource>).ptr;
      plVar2 = *(long **)((long)pRVar1 + lVar5 + -0x10);
      plVar4 = (long *)((long)&(pRVar1->id).id + lVar5);
      if (plVar4 != plVar2) {
        operator_delete(plVar2,*plVar4 + 1);
        uVar3 = (this->super_VectorView<diligent_spirv_cross::Resource>).buffer_size;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 < uVar3);
  }
  (this->super_VectorView<diligent_spirv_cross::Resource>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}